

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O1

void __thiscall
QGraphicsView::ensureVisible(QGraphicsView *this,QRectF *rect,int xmargin,int ymargin)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QGraphicsViewPrivate *this_00;
  long lVar5;
  long lVar6;
  QWidget *pQVar7;
  QScrollBar *pQVar8;
  long in_FS_OFFSET;
  double dVar9;
  double dVar10;
  double dVar11;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsViewPrivate **)(this + 8);
  pQVar7 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
  iVar1 = (pQVar7->data->crect).x2.m_i;
  iVar2 = (pQVar7->data->crect).x1.m_i;
  pQVar7 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
  iVar3 = (pQVar7->data->crect).y2.m_i;
  iVar4 = (pQVar7->data->crect).y1.m_i;
  local_58.w._0_4_ = 0xffffffff;
  local_58.w._4_4_ = 0xffffffff;
  local_58.h._0_4_ = 0xffffffff;
  local_58.h._4_4_ = 0xffffffff;
  local_58.xp._0_4_ = 0xffffffff;
  local_58.xp._4_4_ = 0xffffffff;
  local_58.yp._0_4_ = 0xffffffff;
  local_58.yp._4_4_ = 0xffffffff;
  QTransform::mapRect(&local_58);
  if ((this_00->field_0x300 & 0x20) != 0) {
    QGraphicsViewPrivate::updateScroll(this_00);
  }
  dVar10 = (double)((iVar1 - iVar2) + 1);
  lVar5 = this_00->scrollX;
  if ((this_00->field_0x300 & 0x20) != 0) {
    QGraphicsViewPrivate::updateScroll(this_00);
  }
  lVar6 = this_00->scrollY;
  dVar11 = (double)xmargin;
  if ((((double)CONCAT44(local_58.xp._4_4_,local_58.xp._0_4_) <= (double)lVar5 + dVar11) &&
      (this_00->leftIndent == 0.0)) && (!NAN(this_00->leftIndent))) {
    pQVar8 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
    QAbstractSlider::setValue
              (&pQVar8->super_QAbstractSlider,
               (int)(((double)CONCAT44(local_58.xp._4_4_,local_58.xp._0_4_) - dVar11) + -0.5));
  }
  dVar9 = (double)((iVar3 - iVar4) + 1);
  if ((((dVar10 + (double)lVar5) - dVar11 <=
        (double)CONCAT44(local_58.xp._4_4_,local_58.xp._0_4_) +
        (double)CONCAT44(local_58.w._4_4_,local_58.w._0_4_)) && (this_00->leftIndent == 0.0)) &&
     (!NAN(this_00->leftIndent))) {
    pQVar8 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
    QAbstractSlider::setValue
              (&pQVar8->super_QAbstractSlider,
               (int)((((double)CONCAT44(local_58.xp._4_4_,local_58.xp._0_4_) +
                      (double)CONCAT44(local_58.w._4_4_,local_58.w._0_4_)) - dVar10) + dVar11 + 0.5)
              );
  }
  dVar10 = (double)ymargin;
  if ((((double)CONCAT44(local_58.yp._4_4_,local_58.yp._0_4_) <= (double)lVar6 + dVar10) &&
      (this_00->topIndent == 0.0)) && (!NAN(this_00->topIndent))) {
    pQVar8 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
    QAbstractSlider::setValue
              (&pQVar8->super_QAbstractSlider,
               (int)(((double)CONCAT44(local_58.yp._4_4_,local_58.yp._0_4_) - dVar10) + -0.5));
  }
  if ((((dVar9 + (double)lVar6) - dVar10 <=
        (double)CONCAT44(local_58.yp._4_4_,local_58.yp._0_4_) +
        (double)CONCAT44(local_58.h._4_4_,local_58.h._0_4_)) && (this_00->topIndent == 0.0)) &&
     (!NAN(this_00->topIndent))) {
    pQVar8 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
    QAbstractSlider::setValue
              (&pQVar8->super_QAbstractSlider,
               (int)((((double)CONCAT44(local_58.yp._4_4_,local_58.yp._0_4_) +
                      (double)CONCAT44(local_58.h._4_4_,local_58.h._0_4_)) - dVar9) + dVar10 + 0.5))
    ;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsView::ensureVisible(const QRectF &rect, int xmargin, int ymargin)
{
    Q_D(QGraphicsView);
    qreal width = viewport()->width();
    qreal height = viewport()->height();
    QRectF viewRect = d->matrix.mapRect(rect);

    qreal left = d->horizontalScroll();
    qreal right = left + width;
    qreal top = d->verticalScroll();
    qreal bottom = top + height;

    if (viewRect.left() <= left + xmargin) {
        // need to scroll from the left
        if (!d->leftIndent)
            horizontalScrollBar()->setValue(int(viewRect.left() - xmargin - 0.5));
    }
    if (viewRect.right() >= right - xmargin) {
        // need to scroll from the right
        if (!d->leftIndent)
            horizontalScrollBar()->setValue(int(viewRect.right() - width + xmargin + 0.5));
    }
    if (viewRect.top() <= top + ymargin) {
        // need to scroll from the top
        if (!d->topIndent)
            verticalScrollBar()->setValue(int(viewRect.top() - ymargin - 0.5));
    }
    if (viewRect.bottom() >= bottom - ymargin) {
        // need to scroll from the bottom
        if (!d->topIndent)
            verticalScrollBar()->setValue(int(viewRect.bottom() - height + ymargin + 0.5));
    }
}